

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void monster_remove_from_targets(chunk *c,monster_conflict *mon)

{
  wchar_t wVar1;
  monster *pmVar2;
  wchar_t i;
  wchar_t idx;
  
  idx = L'\x01';
  while( true ) {
    wVar1 = cave_monster_max((chunk_conflict *)c);
    if (wVar1 <= idx) break;
    pmVar2 = cave_monster((chunk_conflict *)c,idx);
    if ((pmVar2->race != (monster_race *)0x0) && ((pmVar2->target).midx == mon->midx)) {
      (pmVar2->target).midx = L'\0';
    }
    idx = idx + L'\x01';
  }
  return;
}

Assistant:

void monster_remove_from_targets(struct chunk *c, struct monster *mon)
{
	int i;
	for (i = 1; i < cave_monster_max(c); i++) {
		struct monster *mon1 = cave_monster(c, i);
		if (!mon1->race) continue;
		if (mon1->target.midx == mon->midx) {
			mon1->target.midx = 0;
		}
	}
}